

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O2

void __thiscall leveldb::Table::ReadFilter(Table *this,Slice *filter_handle_value)

{
  Rep *pRVar1;
  FilterBlockReader *this_00;
  ReadOptions opt;
  BlockContents block;
  BlockHandle filter_handle;
  long local_30;
  Slice v;
  
  v.data_ = filter_handle_value->data_;
  v.size_ = filter_handle_value->size_;
  filter_handle.offset_._0_4_ = 0xffffffff;
  filter_handle.offset_._4_4_ = 0xffffffff;
  filter_handle.size_._0_4_ = 0xffffffff;
  filter_handle.size_._4_4_ = 0xffffffff;
  BlockHandle::DecodeFrom((BlockHandle *)&opt,(Slice *)&filter_handle);
  Status::~Status((Status *)&opt);
  if (CONCAT62(opt._2_6_,CONCAT11(opt.fill_cache,opt.verify_checksums)) == 0) {
    opt.fill_cache = true;
    opt.snapshot = (Snapshot *)0x0;
    opt.decompress_allocator = (DecompressAllocator *)0x0;
    pRVar1 = this->rep_;
    opt.verify_checksums = (pRVar1->options).paranoid_checks == true;
    block.data.data_ = "";
    block.data.size_ = 0;
    ReadBlock((leveldb *)&local_30,pRVar1->file,&pRVar1->options,&opt,&filter_handle,&block);
    Status::~Status((Status *)&local_30);
    if (local_30 == 0) {
      pRVar1 = this->rep_;
      if (block.heap_allocated == true) {
        pRVar1->filter_data = block.data.data_;
      }
      this_00 = (FilterBlockReader *)operator_new(0x28);
      FilterBlockReader::FilterBlockReader(this_00,(pRVar1->options).filter_policy,&block.data);
      this->rep_->filter = this_00;
    }
  }
  return;
}

Assistant:

void Table::ReadFilter(const Slice& filter_handle_value) {
  Slice v = filter_handle_value;
  BlockHandle filter_handle;
  if (!filter_handle.DecodeFrom(&v).ok()) {
    return;
  }

  // We might want to unify with ReadBlock() if we start
  // requiring checksum verification in Table::Open.
  ReadOptions opt;
  if (rep_->options.paranoid_checks) {
    opt.verify_checksums = true;
  }
  BlockContents block;
  if (!ReadBlock(rep_->file, rep_->options, opt, filter_handle, &block).ok()) {
    return;
  }
  if (block.heap_allocated) {
    rep_->filter_data = block.data.data();  // Will need to delete later
  }
  rep_->filter = new FilterBlockReader(rep_->options.filter_policy, block.data);
}